

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterRender.cpp
# Opt level: O1

void * FilterRender::render(void *data,uint width,uint height,Config *config)

{
  uint uVar1;
  Filter *pFVar2;
  uint uVar3;
  void *pvVar4;
  long lVar5;
  vector<Geometry::Point,_std::allocator<Geometry::Point>_> local_48;
  
  if ((config != (Config *)0x0) && (uVar1 = config->nFilters, 0 < (long)(int)uVar1)) {
    lVar5 = 0;
    do {
      uVar3 = (**config->filters[lVar5]->_vptr_Filter)();
      switch(uVar3 & 0xff) {
      case 0:
        doFlip(data,width,height,*(bool *)&config->filters[lVar5][1]._vptr_Filter);
      case 2:
        pFVar2 = config->filters[lVar5];
        doColor(data,width,height,*(u_int8_t *)&pFVar2[1]._vptr_Filter,
                *(u_int8_t *)((long)&pFVar2[1]._vptr_Filter + 1),
                *(u_int8_t *)((long)&pFVar2[1]._vptr_Filter + 2),'\0');
      case 3:
        doAuto(data,width,height);
      case 1:
        std::vector<Geometry::Point,_std::allocator<Geometry::Point>_>::vector
                  (&local_48,
                   (vector<Geometry::Point,_std::allocator<Geometry::Point>_> *)
                   (config->filters[lVar5] + 1));
        pvVar4 = doSlice(data,width,height,&local_48);
        std::vector<Geometry::Point,_std::allocator<Geometry::Point>_>::~vector(&local_48);
        _Unwind_Resume(pvVar4);
      }
      lVar5 = lVar5 + 1;
    } while ((int)uVar1 != lVar5);
  }
  return data;
}

Assistant:

void* FilterRender::render(void *data, uint width, uint height, Config *config) {

	//data = FilterRender::doColor(data, width, height, time(0)%255, time(0)*2%255, time(0)*3%255, 255);

	if(config == NULL) return data;
	int n = config->nFilters;

	for(int i=0;i<n;++i)
	{
		switch (config->filters[i]->type())
		{
			case 0:
			{
				FilterFlip *f = (FilterFlip*)config->filters[i];
				data = FilterRender::doFlip(data, width, height, f->isLR);
				break;
			}
			case 1:
			{
				FilterSlicer *f = (FilterSlicer*)config->filters[i];
				data = FilterRender::doSlice(data, width, height, f->poly);
				break;
			}
			case 2:
			{
				FilterColor *f = (FilterColor*)config->filters[i];
				data = FilterRender::doColor(data, width, height, f->r, f->g, f->b, f->a);
				break;
			}
			case 3:
			{
				FilterAuto *f = (FilterAuto*)config->filters[i];
				data = FilterRender::doAuto(data, width, height);
				break;
			}

		}

	}
	return data;
}